

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Member.cpp
# Opt level: O3

MemberListEntry * __thiscall
MemberListEntry::operator=(MemberListEntry *this,MemberListEntry *anotherMLE)

{
  short sVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = anotherMLE->timestamp;
  iVar2 = anotherMLE->id;
  sVar1 = anotherMLE->port;
  this->heartbeat = anotherMLE->heartbeat;
  this->timestamp = lVar3;
  this->id = iVar2;
  this->port = sVar1;
  return this;
}

Assistant:

MemberListEntry& MemberListEntry::operator =(const MemberListEntry &anotherMLE) {
	MemberListEntry temp(anotherMLE);
	swap(heartbeat, temp.heartbeat);
	swap(id, temp.id);
	swap(port, temp.port);
	swap(timestamp, temp.timestamp);
	return *this;
}